

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateCommand.h
# Opt level: O3

cmCommand * __thiscall cmCTestUpdateCommand::Clone(cmCTestUpdateCommand *this)

{
  cmCTestScriptHandler *pcVar1;
  cmCTestHandlerCommand *this_00;
  
  this_00 = (cmCTestHandlerCommand *)operator_new(0xa8);
  cmCTestHandlerCommand::cmCTestHandlerCommand(this_00);
  (this_00->super_cmCTestCommand).super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestHandlerCommand_00780d98;
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTestScriptHandler;
  (this_00->super_cmCTestCommand).CTest =
       (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
  (this_00->super_cmCTestCommand).CTestScriptHandler = pcVar1;
  return (cmCommand *)this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE
  {
    cmCTestUpdateCommand* ni = new cmCTestUpdateCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
  }